

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_shutdown.c
# Opt level: O3

void routine(void *arg)

{
  int iVar1;
  char *in_RCX;
  int sock;
  int sock_00;
  
  iVar1 = nn_socket(1,0x21);
  if (-1 < iVar1) {
    test_connect_impl((char *)0x32,iVar1,sock,in_RCX);
    test_close_impl((char *)0x33,iVar1,sock_00);
    return;
  }
  iVar1 = nn_errno();
  if (iVar1 == 0x18) {
    return;
  }
  routine_cold_1();
}

Assistant:

static void routine (NN_UNUSED void *arg)
{
    int s;

    s = nn_socket (AF_SP, NN_SUB);
    if (s < 0 && nn_errno () == EMFILE)
        return;
    errno_assert (s >= 0);
    test_connect (s, SOCKET_ADDRESS);
    test_close (s);
}